

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall
Dialog::Dialog(Dialog *this,Theme *theme,ALLEGRO_DISPLAY *display,int grid_m,int grid_n)

{
  char cVar1;
  ALLEGRO_EVENT_QUEUE *pAVar2;
  undefined8 uVar3;
  
  this->theme = theme;
  this->display = display;
  this->grid_m = grid_m;
  this->grid_n = grid_n;
  this->x_padding = 1;
  this->y_padding = 1;
  this->draw_requested = true;
  this->quit_requested = false;
  (this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->all_widgets;
  (this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->all_widgets;
  (this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node._M_size
       = 0;
  this->mouse_over_widget = (Widget *)0x0;
  this->mouse_down_widget = (Widget *)0x0;
  this->key_widget = (Widget *)0x0;
  this->event_handler = (EventHandler *)0x0;
  pAVar2 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  this->event_queue = pAVar2;
  uVar3 = al_get_keyboard_event_source();
  al_register_event_source(pAVar2,uVar3);
  pAVar2 = this->event_queue;
  uVar3 = al_get_mouse_event_source();
  al_register_event_source(pAVar2,uVar3);
  pAVar2 = this->event_queue;
  uVar3 = al_get_display_event_source(display);
  al_register_event_source(pAVar2,uVar3);
  cVar1 = al_is_touch_input_installed();
  if (cVar1 != '\0') {
    pAVar2 = this->event_queue;
    uVar3 = al_get_touch_input_mouse_emulation_event_source();
    al_register_event_source(pAVar2,uVar3);
  }
  return;
}

Assistant:

Dialog::Dialog(const Theme & theme, ALLEGRO_DISPLAY *display,
      int grid_m, int grid_n):
   theme(theme),
   display(display),
   grid_m(grid_m),
   grid_n(grid_n),
   x_padding(1),
   y_padding(1),

   draw_requested(true),
   quit_requested(false),
   mouse_over_widget(NULL),
   mouse_down_widget(NULL),
   key_widget(NULL),

   event_handler(NULL)
{
   this->event_queue = al_create_event_queue();
   al_register_event_source(this->event_queue, al_get_keyboard_event_source());
   al_register_event_source(this->event_queue, al_get_mouse_event_source());
   al_register_event_source(this->event_queue, al_get_display_event_source(display));
   if (al_is_touch_input_installed()) {
      al_register_event_source(this->event_queue,
         al_get_touch_input_mouse_emulation_event_source());
   }
}